

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
vkt::getValidationLayers_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,vkt *this,
          vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *supportedLayers)

{
  char *__s;
  bool bVar1;
  long lVar2;
  allocator<char> local_141;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_140;
  string local_138;
  vkt *local_118;
  RequiredLayer local_110;
  Maybe<unsigned_int> local_b0;
  Maybe<unsigned_int> local_a0;
  Maybe<unsigned_int> local_90;
  Maybe<unsigned_int> local_80;
  Maybe<unsigned_int> local_70;
  Maybe<unsigned_int> local_60;
  Maybe<unsigned_int> local_50;
  Maybe<unsigned_int> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_140 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  local_118 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"VK_LAYER_LUNARG_standard_validation","");
  local_40.m_ptr = (uint *)0x0;
  local_50.m_ptr = (uint *)0x0;
  local_60.m_ptr = (uint *)0x0;
  local_70.m_ptr = (uint *)0x0;
  ::vk::RequiredLayer::RequiredLayer(&local_110,&local_138,&local_40,&local_50,&local_60,&local_70);
  bVar1 = ::vk::isLayerSupported
                    ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                     local_118,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
    operator_delete(local_110.name._M_dataplus._M_p,local_110.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    local_110.name._M_dataplus._M_p = (pointer)&local_110.name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"VK_LAYER_LUNARG_standard_validation","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_140,&local_110.name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
      operator_delete(local_110.name._M_dataplus._M_p,
                      local_110.name.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    lVar2 = 0;
    do {
      __s = *(char **)((long)getValidationLayers::s_defaultLayers + lVar2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,__s,&local_141);
      local_80.m_ptr = (uint *)0x0;
      local_90.m_ptr = (uint *)0x0;
      local_a0.m_ptr = (uint *)0x0;
      local_b0.m_ptr = (uint *)0x0;
      ::vk::RequiredLayer::RequiredLayer
                (&local_110,&local_138,&local_80,&local_90,&local_a0,&local_b0);
      bVar1 = ::vk::isLayerSupported
                        ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                         local_118,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
        operator_delete(local_110.name._M_dataplus._M_p,
                        local_110.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,__s,(allocator<char> *)&local_138);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_140,&local_110.name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
          operator_delete(local_110.name._M_dataplus._M_p,
                          local_110.name.field_2._M_allocated_capacity + 1);
        }
      }
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x40);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_140;
}

Assistant:

vector<string> getValidationLayers (const vector<VkLayerProperties>& supportedLayers)
{
	static const char*	s_magicLayer		= "VK_LAYER_LUNARG_standard_validation";
	static const char*	s_defaultLayers[]	=
	{
		"VK_LAYER_GOOGLE_threading",
		"VK_LAYER_LUNARG_parameter_validation",
		"VK_LAYER_LUNARG_device_limits",
		"VK_LAYER_LUNARG_object_tracker",
		"VK_LAYER_LUNARG_image",
		"VK_LAYER_LUNARG_core_validation",
		"VK_LAYER_LUNARG_swapchain",
		"VK_LAYER_GOOGLE_unique_objects"
	};

	vector<string>		enabledLayers;

	if (isLayerSupported(supportedLayers, RequiredLayer(s_magicLayer)))
		enabledLayers.push_back(s_magicLayer);
	else
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_defaultLayers); ++ndx)
		{
			if (isLayerSupported(supportedLayers, RequiredLayer(s_defaultLayers[ndx])))
				enabledLayers.push_back(s_defaultLayers[ndx]);
		}
	}

	return enabledLayers;
}